

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_bean_boilerplate
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  string *psVar1;
  t_field *field;
  undefined8 out_00;
  bool bVar2;
  ostream *poVar3;
  t_dart_generator *this_00;
  t_dart_generator *ptVar4;
  char *pcVar5;
  string field_name;
  string cap_name;
  allocator local_191;
  t_type *local_190;
  undefined1 local_188 [56];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_188._32_8_ = out;
  local_188._40_8_ = tstruct;
  for (local_188._48_8_ =
            (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
      (pointer)local_188._48_8_ !=
      (((members_type *)(local_188._40_8_ + 0x88))->
      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish; local_188._48_8_ = local_188._48_8_ + 8) {
    field = *(t_field **)local_188._48_8_;
    local_190 = t_type::get_true_type(field->type_);
    ptVar4 = (t_dart_generator *)&field->name_;
    std::__cxx11::string::string((string *)&local_50,(string *)ptVar4);
    this_00 = (t_dart_generator *)local_188;
    get_member_name((string *)this_00,ptVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_90,(string *)this_00);
    get_cap_name(&local_70,this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    out_00 = local_188._32_8_;
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_188._32_8_);
    poVar3 = std::operator<<(poVar3,"// ");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    generate_dart_doc(this,(ostream *)out_00,&field->super_t_doc);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
    psVar1 = (string *)(local_188 + 0x38);
    type_name_abi_cxx11_(psVar1,this,local_190);
    poVar3 = std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::operator<<(poVar3," get ");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    poVar3 = std::operator<<(poVar3," => this._");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&endl2_abi_cxx11_);
    std::__cxx11::string::~string((string *)psVar1);
    generate_dart_doc(this,(ostream *)out_00,&field->super_t_doc);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
    poVar3 = std::operator<<(poVar3,"set ");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    poVar3 = std::operator<<(poVar3,"(");
    psVar1 = (string *)(local_188 + 0x38);
    type_name_abi_cxx11_(psVar1,this,local_190);
    poVar3 = std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string((string *)psVar1);
    std::__cxx11::string::string((string *)&local_b0," ",(allocator *)psVar1);
    scope_up(this,(ostream *)out_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
    poVar3 = std::operator<<(poVar3,"this._");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)local_188);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    generate_isset_set(this,(ostream *)out_00,field);
    std::__cxx11::string::string((string *)&local_f0,(string *)&endl2_abi_cxx11_);
    scope_down(this,(ostream *)out_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
    poVar3 = std::operator<<(poVar3,"bool is");
    ptVar4 = (t_dart_generator *)0x2e61dc;
    std::__cxx11::string::string((string *)&local_110,"set",&local_191);
    psVar1 = (string *)(local_188 + 0x38);
    get_cap_name(psVar1,ptVar4,&local_110);
    poVar3 = std::operator<<(poVar3,(string *)psVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::operator<<(poVar3,"()");
    std::__cxx11::string::~string((string *)psVar1);
    std::__cxx11::string::~string((string *)&local_110);
    bVar2 = type_can_be_null(this,local_190);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)out_00," => this.");
      poVar3 = std::operator<<(poVar3,(string *)local_188);
      pcVar5 = " != null;";
    }
    else {
      poVar3 = std::operator<<((ostream *)out_00," => this.__isset_");
      poVar3 = std::operator<<(poVar3,(string *)local_188);
      pcVar5 = ";";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,(string *)&endl2_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
    poVar3 = std::operator<<(poVar3,"unset");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::operator<<(poVar3,"()");
    std::__cxx11::string::string((string *)&local_d0," ",(allocator *)(local_188 + 0x38));
    scope_up(this,(ostream *)out_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar2 = type_can_be_null(this,local_190);
    if (bVar2) {
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
      poVar3 = std::operator<<(poVar3,"this.");
      poVar3 = std::operator<<(poVar3,(string *)local_188);
      pcVar5 = " = null;";
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)out_00);
      poVar3 = std::operator<<(poVar3,"this.__isset_");
      poVar3 = std::operator<<(poVar3,(string *)local_188);
      pcVar5 = " = false;";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_130,(string *)&endl2_abi_cxx11_);
    scope_down(this,(ostream *)out_00,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_188);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_bean_boilerplate(ostream& out,
                                                    t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    t_type* type = get_true_type(field->get_type());
    std::string field_name = get_member_name(field->get_name());
    std::string cap_name = get_cap_name(field_name);

    indent(out) << "// " << field_name << endl;

    // Simple getter
    generate_dart_doc(out, field);
    indent(out) << type_name(type) << " get " << field_name << " => this._" << field_name << ";" << endl2;

    // Simple setter
    generate_dart_doc(out, field);
    indent(out) << "set " << field_name << "(" << type_name(type) << " " << field_name << ")";
    scope_up(out);
    indent(out) << "this._" << field_name << " = " << field_name << ";" << endl;
    generate_isset_set(out, field);
    scope_down(out, endl2);

    // isSet method
    indent(out) << "bool is" << get_cap_name("set") << cap_name << "()";
    if (type_can_be_null(type)) {
      out << " => this." << field_name << " != null;" << endl2;
    } else {
      out << " => this.__isset_" << field_name << ";" << endl2;
    }

    // Unsetter
    indent(out) << "unset" << cap_name << "()";
    scope_up(out);
    if (type_can_be_null(type)) {
      indent(out) << "this." << field_name << " = null;" << endl;
    } else {
      indent(out) << "this.__isset_" << field_name << " = false;" << endl;
    }
    scope_down(out, endl2);
  }
}